

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IM483I.h
# Opt level: O0

int SetMotorTorqueIM483I(IM483I *pIM483I,int holdpercent,int runpercent)

{
  int writebuflen;
  int iVar1;
  size_t sVar2;
  uint local_454;
  uint local_450;
  int local_44c;
  uint local_448;
  uint local_444;
  int local_440;
  uint8 local_438 [4];
  int recvbuflen;
  char recvbuf [512];
  uint8 local_228 [4];
  int sendbuflen;
  char sendbuf [512];
  int runpercent_local;
  int holdpercent_local;
  IM483I *pIM483I_local;
  
  local_440 = holdpercent;
  if (99 < holdpercent) {
    local_440 = 100;
  }
  if (local_440 < 1) {
    local_448 = 0;
  }
  else {
    local_444 = holdpercent;
    if (99 < holdpercent) {
      local_444 = 100;
    }
    local_448 = local_444;
  }
  local_44c = runpercent;
  if (99 < runpercent) {
    local_44c = 100;
  }
  if (local_44c < 1) {
    local_454 = 0;
  }
  else {
    local_450 = runpercent;
    if (99 < runpercent) {
      local_450 = 100;
    }
    local_454 = local_450;
  }
  memset(local_228,0,0x200);
  sprintf((char *)local_228,"Y %d %d\r",(ulong)local_448,(ulong)local_454);
  sVar2 = strlen((char *)local_228);
  writebuflen = (int)sVar2;
  iVar1 = WriteDataIM483I(pIM483I,local_228,writebuflen,pIM483I->bytedelayus);
  if (iVar1 != 0) {
    printf("Error writing data to a IM483I. \n");
    return 1;
  }
  if ((pIM483I->bSaveRawData != 0) && (pIM483I->pfSaveFile != (FILE *)0x0)) {
    fwrite(local_228,(long)writebuflen,1,(FILE *)pIM483I->pfSaveFile);
    fflush((FILE *)pIM483I->pfSaveFile);
  }
  mSleep(0x14);
  if (pIM483I->bCheckState != 0) {
    memset(local_438,0,0x200);
    iVar1 = ReadAllRS232Port(&pIM483I->RS232Port,local_438,writebuflen + 1);
    if (iVar1 != 0) {
      printf("Error reading data from a IM483I. \n");
      return 1;
    }
    if ((pIM483I->bSaveRawData != 0) && (pIM483I->pfSaveFile != (FILE *)0x0)) {
      fwrite(local_438,(long)(writebuflen + 1),1,(FILE *)pIM483I->pfSaveFile);
      fflush((FILE *)pIM483I->pfSaveFile);
    }
    iVar1 = strncmp((char *)local_438,(char *)local_228,(long)writebuflen);
    if ((iVar1 != 0) || (local_438[writebuflen] != '\n')) {
      printf("Error reading data from a IM483I : Invalid data. \n");
      return 4;
    }
  }
  return 0;
}

Assistant:

inline int SetMotorTorqueIM483I(IM483I* pIM483I, int holdpercent, int runpercent)
{
	char sendbuf[MAX_NB_BYTES_IM483I];
	int sendbuflen = 0;
	char recvbuf[MAX_NB_BYTES_IM483I];
	int recvbuflen = 0;

	holdpercent = max(min(holdpercent, 100), 0);
	runpercent = max(min(runpercent, 100), 0);

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sprintf(sendbuf, "Y %d %d\r", holdpercent, runpercent);
	sendbuflen = (int)strlen(sendbuf);

	if (WriteDataIM483I(pIM483I, (unsigned char*)sendbuf, sendbuflen, pIM483I->bytedelayus) != EXIT_SUCCESS)
	{
		printf("Error writing data to a IM483I. \n");
		return EXIT_FAILURE;
	}
	if ((pIM483I->bSaveRawData)&&(pIM483I->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pIM483I->pfSaveFile);
		fflush(pIM483I->pfSaveFile);
	}

	mSleep(20);

	if (pIM483I->bCheckState)
	{
		// Should echo and add \n...

		// Prepare the buffer that should receive data from the device.
		memset(recvbuf, 0, sizeof(recvbuf));
		recvbuflen = sendbuflen+1; // The last character must be a 0 to be a valid string for sscanf.

		if (ReadAllRS232Port(&pIM483I->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
		{
			printf("Error reading data from a IM483I. \n");
			return EXIT_FAILURE;
		}
		if ((pIM483I->bSaveRawData)&&(pIM483I->pfSaveFile))
		{
			fwrite(recvbuf, recvbuflen, 1, pIM483I->pfSaveFile);
			fflush(pIM483I->pfSaveFile);
		}

		// Display and analyze received data.
		//printf("Received : \"%s\"\n", recvbuf);
		if ((strncmp(recvbuf, sendbuf, sendbuflen) != 0)||(recvbuf[recvbuflen-1] != '\n'))
		{
			printf("Error reading data from a IM483I : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
	}

	return EXIT_SUCCESS;
}